

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

void __thiscall
libtorrent::portmap_error_alert::portmap_error_alert
          (portmap_error_alert *this,stack_allocator *param_1,port_mapping_t i,portmap_transport t,
          error_code *e)

{
  error_category *peVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  undefined3 uVar5;
  undefined3 in_register_00000009;
  string local_40;
  
  alert::alert(&this->super_alert);
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__portmap_error_alert_00431290;
  (this->mapping).m_val = i.m_val;
  this->map_transport = t;
  bVar4 = e->failed_;
  uVar5 = *(undefined3 *)&e->field_0x5;
  uVar2 = *(undefined4 *)&e->cat_;
  uVar3 = *(undefined4 *)((long)&e->cat_ + 4);
  (this->error).val_ = e->val_;
  (this->error).failed_ = bVar4;
  *(undefined3 *)&(this->error).field_0x5 = uVar5;
  *(undefined4 *)&(this->error).cat_ = uVar2;
  *(undefined4 *)((long)&(this->error).cat_ + 4) = uVar3;
  this->map_type = CONCAT31(in_register_00000009,t);
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(&local_40,peVar1,(ulong)(uint)(this->error).val_);
  convert_from_native(&this->msg,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

portmap_error_alert::portmap_error_alert(aux::stack_allocator&
		, port_mapping_t const i, portmap_transport const t, error_code const& e)
		: mapping(i)
		, map_transport(t)
		, error(e)
#if TORRENT_ABI_VERSION == 1
		, map_type(static_cast<int>(t))
		, msg(convert_from_native(error.message()))
#endif
	{}